

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iaf_psc_alpha.cpp
# Opt level: O1

double __thiscall
iaf_psc_alpha::propagator_32(iaf_psc_alpha *this,double tau_syn,double tau,double C,double h)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar1 = -h / tau;
  dVar2 = exp(dVar1);
  dVar1 = exp(dVar1);
  dVar1 = dVar1 * (h / C);
  dVar3 = exp(-h / tau_syn);
  dVar4 = expm1((1.0 / tau_syn - 1.0 / tau) * h);
  if (((tau != tau_syn) || (NAN(tau) || NAN(tau_syn))) &&
     ((dVar4 = (-tau / ((1.0 - tau / tau_syn) * C)) * dVar3 * dVar4, 0.1 <= ABS(tau - tau_syn) ||
      (dVar2 = ABS((tau_syn - tau) * (1.0 / ((C + C) * tau * tau)) * h * h * dVar2),
      ABS(dVar4 - dVar1) <= dVar2 + dVar2)))) {
    dVar1 = dVar4;
  }
  return dVar1;
}

Assistant:

double iaf_psc_alpha::propagator_32( double tau_syn, double tau, double C, double h )
{
  const double P32_linear = 1 / ( 2. * C * tau * tau ) * h * h * ( tau_syn - tau ) * std::exp( -h / tau );
  const double P32_singular = h / C * std::exp( -h / tau );
  const double P32 =
    -tau / ( C * ( 1 - tau / tau_syn ) ) * std::exp( -h / tau_syn ) * std::expm1( h * ( 1 / tau_syn - 1 / tau ) );

  const double de32 = std::abs( P32 - P32_singular );

  if ( tau == tau_syn or ( std::abs( tau - tau_syn ) < 0.1 and de32 > 2 * std::abs( P32_linear ) ) )
  {
    return P32_singular;
  }
  else
  {
    return P32;
  }
}